

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O2

void calculate_fake_group_size_and_set(Am_Object *fake_group,Am_Value_List *list)

{
  int iVar1;
  int value;
  int iVar2;
  int max_bottom;
  int max_right;
  int min_top;
  int min_left;
  Am_Object owner;
  Am_Object local_38;
  int top_offset;
  int left_offset;
  Am_Value_List local_28;
  
  min_left = 29999;
  min_top = 29999;
  max_right = -29999;
  max_bottom = -29999;
  owner.data = (Am_Object_Data *)0x0;
  Am_Value_List::Am_Value_List(&local_28,list);
  calculate_group_size(&local_28,&min_left,&min_top,&max_right,&max_bottom,&owner);
  Am_Value_List::~Am_Value_List(&local_28);
  Am_Object::Get_Owner(&local_38,(Am_Slot_Flags)fake_group);
  Am_Translate_Coordinates(&owner,0,0,&local_38,&left_offset,&top_offset);
  Am_Object::~Am_Object(&local_38);
  iVar2 = min_left;
  Am_Object::Set(fake_group,100,left_offset + min_left,0);
  iVar1 = min_top;
  Am_Object::Set(fake_group,0x65,top_offset + min_top,0);
  value = max_right - iVar2;
  if (max_right - iVar2 == 0) {
    value = 1;
  }
  Am_Object::Set(fake_group,0x66,value,0);
  iVar2 = max_bottom - iVar1;
  if (max_bottom - iVar1 == 0) {
    iVar2 = 1;
  }
  Am_Object::Set(fake_group,0x67,iVar2,0);
  Am_Object::~Am_Object(&owner);
  return;
}

Assistant:

void
calculate_fake_group_size_and_set(Am_Object &fake_group, Am_Value_List &list)
{
  int min_left = 29999;
  int min_top = 29999;
  int max_right = -29999;
  int max_bottom = -29999;
  int left_offset, top_offset;
  Am_Object owner;
  calculate_group_size(list, min_left, min_top, max_right, max_bottom, owner);
  Am_Translate_Coordinates(owner, 0, 0, fake_group.Get_Owner(), left_offset,
                           top_offset);
  fake_group.Set(Am_LEFT, min_left + left_offset);
  fake_group.Set(Am_TOP, min_top + top_offset);
  int wh = max_right - min_left;
  if (wh == 0)
    wh = 1;
  fake_group.Set(Am_WIDTH, wh);
  wh = max_bottom - min_top;
  if (wh == 0)
    wh = 1;
  fake_group.Set(Am_HEIGHT, wh);
  //std::cout << "Calculate fake group " << fake_group << " size = " << min_left
  // << "," << min_top << "," << max_right - min_left << ","
  // << max_bottom - min_top <<std::endl <<std::flush;
}